

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_VerilogSimpleLex(char *pFileName,Abc_Nam_t *pNames)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  char *__s;
  size_t sVar4;
  char *pStr;
  int Entry;
  
  p = Vec_IntAlloc(1000);
  __s = Extra_FileReadContents(pFileName);
  sVar4 = strlen(__s);
  if (__s == (char *)0x0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    Acb_VerilogRemoveComments(__s);
    for (pStr = strtok(__s,"  \n\r\t(),;="); pStr != (char *)0x0;
        pStr = strtok(pStr,"  \n\r\t(),;=")) {
      iVar2 = Abc_NamStrFindOrAdd(pNames,pStr,(int *)0x0);
      iVar3 = strcmp(pStr,"assign");
      Entry = iVar2;
      if (iVar3 == 0) {
        Entry = 6;
      }
      Vec_IntPush(p,Entry);
      if (iVar2 - 6U < 8) {
        for (; cVar1 = *pStr, pStr < __s + sVar4; pStr = pStr + 1) {
          if (cVar1 == '\n') goto LAB_00324ede;
          if (cVar1 == '(') goto LAB_00324ee0;
        }
        if (cVar1 != '(') goto LAB_00324ede;
      }
      else {
LAB_00324ede:
        pStr = (char *)0x0;
      }
LAB_00324ee0:
    }
    free(__s);
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_VerilogSimpleLex( char * pFileName, Abc_Nam_t * pNames )
{
    Vec_Int_t * vBuffer = Vec_IntAlloc( 1000 );
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pToken, * pStart, * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    Acb_VerilogRemoveComments( pBuffer );
    pToken = strtok( pBuffer, "  \n\r\t(),;=" );
    while ( pToken )
    {
        int iToken = Abc_NamStrFindOrAdd( pNames, pToken, NULL );
        if ( !strcmp(pToken, "assign") )
            Vec_IntPush( vBuffer, ACB_BUF );
        else
            Vec_IntPush( vBuffer, iToken );
        if ( iToken >= ACB_BUF && iToken < ACB_UNUSED )
        {
            for ( pStart = pToken; pStart < pLimit && *pStart != '\n'; pStart++ )
                if ( *pStart == '(' )
                    break;
            if ( *pStart == '(' )
            {
                pToken = strtok( pStart, "  \n\r\t(),;=" );
                continue;
            }
        }
        pToken = strtok( NULL, "  \n\r\t(),;=" );
    }
    ABC_FREE( pBuffer );
    return vBuffer;
}